

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O0

int ui_entry_combiner_lookup(char *name)

{
  int iVar1;
  int iVar2;
  int cmp;
  int imid;
  int ihigh;
  int ilow;
  char *name_local;
  
  imid = 0;
  cmp = 9;
  iVar1 = cmp;
  while( true ) {
    cmp = iVar1;
    if (imid == cmp) {
      return 0;
    }
    iVar1 = (imid + cmp) / 2;
    iVar2 = strcmp(combiners[iVar1].name,name);
    if (iVar2 == 0) break;
    if (iVar2 < 0) {
      imid = iVar1 + 1;
      iVar1 = cmp;
    }
  }
  return iVar1 + 1;
}

Assistant:

int ui_entry_combiner_lookup(const char *name)
{
	/* Sorted alphabetically so use a binary search. */
	int ilow = 0, ihigh = N_ELEMENTS(combiners);

	while (1) {
		int imid, cmp;

		if (ilow == ihigh) {
			return 0;
		}
		imid = (ilow + ihigh) / 2;
		cmp = strcmp(combiners[imid].name, name);
		if (cmp == 0) {
			return imid + 1;
		}
		if (cmp < 0) {
			ilow = imid + 1;
		} else {
			ihigh = imid;
		}
	}
}